

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O1

CURLcode Curl_cwriter_add(Curl_easy *data,Curl_cwriter *writer)

{
  CURLcode CVar1;
  Curl_cwriter *pCVar2;
  Curl_cwriter *pCVar3;
  Curl_cwriter **ppCVar4;
  
  if (((data->req).writer_stack == (Curl_cwriter *)0x0) &&
     (CVar1 = do_init_stack(data), CVar1 != CURLE_OK)) {
    return CVar1;
  }
  ppCVar4 = &(data->req).writer_stack;
  pCVar3 = *ppCVar4;
  if ((pCVar3 != (Curl_cwriter *)0x0) && (pCVar3->phase < writer->phase)) {
    do {
      pCVar2 = pCVar3;
      pCVar3 = pCVar2->next;
      if (pCVar3 == (Curl_cwriter *)0x0) break;
    } while (pCVar3->phase < writer->phase);
    ppCVar4 = &pCVar2->next;
  }
  writer->next = pCVar3;
  *ppCVar4 = writer;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_cwriter_add(struct Curl_easy *data,
                          struct Curl_cwriter *writer)
{
  CURLcode result;
  struct Curl_cwriter **anchor = &data->req.writer_stack;

  if(!*anchor) {
    result = do_init_stack(data);
    if(result)
      return result;
  }

  /* Insert the writer as first in its phase.
   * Skip existing writers of lower phases. */
  while(*anchor && (*anchor)->phase < writer->phase)
    anchor = &((*anchor)->next);
  writer->next = *anchor;
  *anchor = writer;
  return CURLE_OK;
}